

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O3

Vector2D __thiscall CGL::UniformGridSampler2D::get_sample(UniformGridSampler2D *this)

{
  result_type rVar1;
  result_type rVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector2D VVar11;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = rVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = rVar2;
  auVar4 = vpunpcklqdq_avx(auVar3,auVar4);
  auVar3 = vpblendd_avx2(auVar4,(undefined1  [16])0x0,10);
  auVar8._8_8_ = 0x4330000000000000;
  auVar8._0_8_ = 0x4330000000000000;
  auVar3 = vpor_avx(auVar3,auVar8);
  auVar4 = vpsrlq_avx(auVar4,0x20);
  auVar9._8_8_ = 0x4530000000000000;
  auVar9._0_8_ = 0x4530000000000000;
  auVar4 = vpor_avx(auVar4,auVar9);
  auVar10._8_8_ = 0x4530000000100000;
  auVar10._0_8_ = 0x4530000000100000;
  auVar4 = vsubpd_avx(auVar4,auVar10);
  auVar5._0_8_ = (auVar3._0_8_ + auVar4._0_8_) * 2.3283064370807974e-10;
  auVar5._8_8_ = (auVar3._8_8_ + auVar4._8_8_) * 2.3283064370807974e-10;
  auVar6._8_8_ = 0x3e7ad7f29abcaf48;
  auVar6._0_8_ = 0x3e7ad7f29abcaf48;
  auVar3 = vmaxpd_avx(auVar6,auVar5);
  auVar7._8_8_ = 0x3feffffffaa19c47;
  auVar7._0_8_ = 0x3feffffffaa19c47;
  auVar3 = vminpd_avx(auVar7,auVar3);
  this->super_Sampler2D = auVar3;
  VVar11.x = auVar3._0_8_;
  VVar11.y = 0.99999999;
  return VVar11;
}

Assistant:

Vector2D UniformGridSampler2D::get_sample() const {

  return Vector2D(random_uniform(), random_uniform());

}